

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O0

void __thiscall fineftp::FtpSession::handleFtpCommandNLST(FtpSession *this,string *param)

{
  FtpSession *this_00;
  bool bVar1;
  Permission PVar2;
  FileType FVar3;
  element_type *peVar4;
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [36];
  undefined4 local_1ac;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
  local_1a8;
  allocator local_171;
  string local_170 [32];
  undefined1 local_150 [8];
  FileStatus dir_status;
  string local_path;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *param_local;
  FtpSession *this_local;
  
  local_18 = param;
  param_local = (string *)this;
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->logged_in_user_);
  if (bVar1) {
    peVar4 = ::std::__shared_ptr_access<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->logged_in_user_);
    PVar2 = operator&(peVar4->permissions_,DirList);
    if (PVar2 == None) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_70,"Permission denied",&local_71);
      sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)local_70);
      ::std::__cxx11::string::~string(local_70);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    else {
      this_00 = (FtpSession *)(dir_status.file_status_.__glibc_reserved + 2);
      toLocalPath(this_00,(string *)this);
      Filesystem::FileStatus::FileStatus((FileStatus *)local_150,(string *)this_00);
      bVar1 = Filesystem::FileStatus::isOk((FileStatus *)local_150);
      if (bVar1) {
        FVar3 = Filesystem::FileStatus::type((FileStatus *)local_150);
        if (FVar3 == Dir) {
          bVar1 = Filesystem::FileStatus::canOpenDir((FileStatus *)local_150);
          if (bVar1) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_170,"Sending name list",&local_171);
            sendFtpMessage(this,FILE_STATUS_OK_OPENING_DATA_CONNECTION,(string *)local_170);
            ::std::__cxx11::string::~string(local_170);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_171);
            Filesystem::dirContent
                      (&local_1a8,(string *)(dir_status.file_status_.__glibc_reserved + 2));
            sendNameList(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
                               *)&local_1a8);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
            ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
                    *)&local_1a8);
          }
          else {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_1d0,"Permission denied",&local_1d1);
            sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)local_1d0);
            ::std::__cxx11::string::~string(local_1d0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
          }
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_1f8,"Path is not a directory",&local_1f9);
          sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)local_1f8);
          ::std::__cxx11::string::~string(local_1f8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
        }
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_220,"Path does not exist",&local_221);
        sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)local_220);
        ::std::__cxx11::string::~string(local_220);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_221);
      }
      local_1ac = 1;
      Filesystem::FileStatus::~FileStatus((FileStatus *)local_150);
      ::std::__cxx11::string::~string((string *)(dir_status.file_status_.__glibc_reserved + 2));
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_38,"Not logged in",&local_39);
    sendFtpMessage(this,NOT_LOGGED_IN,(string *)local_38);
    ::std::__cxx11::string::~string(local_38);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

void FtpSession::handleFtpCommandNLST(const std::string& param)
  {
    if (!logged_in_user_)
    {
      sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN,    "Not logged in");
      return;
    }

    // RFC 959 does not allow ACTION_NOT_TAKEN (-> permanent error), so we return a temporary error (FILE_ACTION_NOT_TAKEN).
    if (static_cast<int>(logged_in_user_->permissions_ & Permission::DirList) == 0)
    {
      sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Permission denied");
      return;
    }

    std::string local_path = toLocalPath(param);
    auto dir_status = Filesystem::FileStatus(local_path);

    if (dir_status.isOk())
    {
      if (dir_status.type() == Filesystem::FileType::Dir)
      {
        if (dir_status.canOpenDir())
        {
          sendFtpMessage(FtpReplyCode::FILE_STATUS_OK_OPENING_DATA_CONNECTION, "Sending name list");
          sendNameList(Filesystem::dirContent(local_path));
          return;
        }
        else
        {
          sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Permission denied");
          return;
        }
      }
      else
      {
        // TODO: RFC959: If the pathname specifies a file then the server should send current information on the file.
        sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Path is not a directory");
        return;
      }
    }
    else
    {
      sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Path does not exist");
      return;
    }
  }